

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfsfileengine.cpp
# Opt level: O0

int __thiscall QFSFileEngine::open(QFSFileEngine *this,char *__file,int __oflag,...)

{
  long lVar1;
  bool bVar2;
  long in_FS_OFFSET;
  QLatin1StringView QVar3;
  QFSFileEnginePrivate *d;
  ProcessOpenModeResult res;
  char *in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff20;
  int in_stack_ffffffffffffff24;
  undefined2 in_stack_ffffffffffffff28;
  undefined1 in_stack_ffffffffffffff2a;
  undefined1 in_stack_ffffffffffffff2b;
  FileError in_stack_ffffffffffffff2c;
  FileError error;
  QAbstractFileEngine *in_stack_ffffffffffffff30;
  QAbstractFileEngine *this_00;
  qsizetype in_stack_ffffffffffffff50;
  QAbstractFileEngine local_40 [2];
  undefined4 local_1c;
  undefined8 in_stack_ffffffffffffffe8;
  QFlagsStorage<QIODeviceBase::OpenModeFlag> openMode;
  
  openMode.i = (Int)((ulong)in_stack_ffffffffffffffe8 >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_1c = SUB84(__file,0);
  d_func((QFSFileEngine *)0x2bc5ef);
  bVar2 = QFileSystemEntry::isEmpty
                    ((QFileSystemEntry *)
                     CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
  if (bVar2) {
    error = NoError;
    this_00 = local_40;
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)this_00,
               (char *)(ulong)CONCAT13(in_stack_ffffffffffffff2b,
                                       CONCAT12(in_stack_ffffffffffffff2a,in_stack_ffffffffffffff28)
                                      ),in_stack_ffffffffffffff24,in_stack_ffffffffffffff18);
    QMessageLogger::warning((QMessageLogger *)this_00,"QFSFileEngine::open: No file name specified")
    ;
    QVar3 = Qt::Literals::StringLiterals::operator____L1
                      ((char *)CONCAT44(error,CONCAT13(in_stack_ffffffffffffff2b,
                                                       CONCAT12(in_stack_ffffffffffffff2a,
                                                                in_stack_ffffffffffffff28))),
                       CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
    QVar3.m_data = (char *)QVar3.m_size;
    QVar3.m_size = in_stack_ffffffffffffff50;
    QString::QString((QString *)this_00,QVar3);
    QAbstractFileEngine::setError
              (this_00,error,
               (QString *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
    QString::~QString((QString *)0x2bc697);
  }
  else {
    processOpenModeFlags((OpenMode)openMode.i);
    QAbstractFileEngine::setError
              (in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c,
               (QString *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
    ProcessOpenModeResult::~ProcessOpenModeResult((ProcessOpenModeResult *)0x2bc7fe);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (uint)*(long *)(in_FS_OFFSET + 0x28) & 0xffffff00;
}

Assistant:

bool QFSFileEngine::open(QIODevice::OpenMode openMode,
                         std::optional<QFile::Permissions> permissions)
{
    Q_ASSERT_X(openMode & QIODevice::Unbuffered, "QFSFileEngine::open",
               "QFSFileEngine no longer supports buffered mode; upper layer must buffer");

    Q_D(QFSFileEngine);
    if (d->fileEntry.isEmpty()) {
        qWarning("QFSFileEngine::open: No file name specified");
        setError(QFile::OpenError, "No file name specified"_L1);
        return false;
    }

    const ProcessOpenModeResult res = processOpenModeFlags(openMode);
    if (!res.ok) {
        setError(QFileDevice::OpenError, res.error);
        return false;
    }

    d->openMode = res.openMode;
    d->lastFlushFailed = false;
    d->tried_stat = 0;
    d->fh = nullptr;
    d->fd = -1;

    return d->nativeOpen(d->openMode, permissions);
}